

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helper.cpp
# Opt level: O3

vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
* Test_Helper::uniformImages
            (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *__return_storage_ptr__,uint32_t count,uint32_t width,uint32_t height)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  undefined8 uVar5;
  uchar *puVar6;
  int iVar7;
  pointer pIVar8;
  Image local_80;
  ImageTemplate<unsigned_char> local_58;
  
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector(__return_storage_ptr__,(ulong)count,(allocator_type *)&local_80);
  pIVar8 = (__return_storage_ptr__->
           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pIVar8 != (__return_storage_ptr__->
                super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,0,0,'\x01','\x01');
      iVar7 = rand();
      uniformImage(&local_80,(uint8_t)iVar7,width,height,&local_58);
      uVar5._0_4_ = pIVar8->_width;
      uVar5._4_4_ = pIVar8->_height;
      pIVar8->_width = local_80._width;
      pIVar8->_height = local_80._height;
      uVar1 = pIVar8->_colorCount;
      pIVar8->_colorCount = local_80._colorCount;
      uVar4 = pIVar8->_rowSize;
      pIVar8->_rowSize = local_80._rowSize;
      uVar2 = pIVar8->_alignment;
      pIVar8->_alignment = local_80._alignment;
      puVar6 = pIVar8->_data;
      pIVar8->_data = local_80._data;
      uVar3 = pIVar8->_type;
      pIVar8->_type = local_80._type;
      local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
      local_80._8_8_ = uVar5;
      local_80._colorCount = uVar1;
      local_80._alignment = uVar2;
      local_80._rowSize = uVar4;
      local_80._data = puVar6;
      local_80._type = uVar3;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
      local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
      pIVar8 = pIVar8 + 1;
    } while (pIVar8 != (__return_storage_ptr__->
                       super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< PenguinV_Image::Image > uniformImages( uint32_t count, uint32_t width, uint32_t height )
    {
        std::vector < PenguinV_Image::Image > image( count );

        for( std::vector< PenguinV_Image::Image >::iterator im = image.begin(); im != image.end(); ++im )
            *im = uniformImage( width, height );

        return image;
    }